

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.cxx
# Opt level: O2

bool cmGetCMakePropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  cmMakefile *pcVar1;
  bool bVar2;
  cmValue cVar3;
  cmGlobalGenerator *pcVar4;
  cmState *this;
  ulong uVar5;
  string_view separator;
  string_view value;
  allocator<char> local_61;
  string output;
  string local_40;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (uVar5 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"called with incorrect number of arguments",
               (allocator<char> *)&local_40);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"NOTFOUND",(allocator<char> *)&local_40);
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"VARIABLES");
    if (bVar2) {
      pcVar1 = status->Makefile;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"VARIABLES",&local_61);
      cVar3 = cmMakefile::GetProperty(pcVar1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (cVar3.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&output);
      }
    }
    else {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,"MACROS");
      if (bVar2) {
        output._M_string_length = 0;
        *output._M_dataplus._M_p = '\0';
        pcVar1 = status->Makefile;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"MACROS",&local_61);
        cVar3 = cmMakefile::GetProperty(pcVar1,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        if (cVar3.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&output);
        }
      }
      else {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1,"COMPONENTS");
        if (bVar2) {
          pcVar4 = cmMakefile::GetGlobalGenerator(status->Makefile);
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_40,&pcVar4->InstallComponents,separator);
          std::__cxx11::string::operator=((string *)&output,(string *)&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
        else if ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != 0) {
          this = cmMakefile::GetState(status->Makefile);
          cVar3 = cmState::GetGlobalProperty
                            (this,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
          if (cVar3.Value != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)&output);
          }
        }
      }
    }
    value._M_str = output._M_dataplus._M_p;
    value._M_len = output._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,name,value);
  }
  std::__cxx11::string::~string((string *)&output);
  return 0x20 < uVar5;
}

Assistant:

bool cmGetCMakePropertyCommand(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& variable = args[0];
  std::string output = "NOTFOUND";

  if (args[1] == "VARIABLES") {
    if (cmValue varsProp = status.GetMakefile().GetProperty("VARIABLES")) {
      output = *varsProp;
    }
  } else if (args[1] == "MACROS") {
    output.clear();
    if (cmValue macrosProp = status.GetMakefile().GetProperty("MACROS")) {
      output = *macrosProp;
    }
  } else if (args[1] == "COMPONENTS") {
    const std::set<std::string>* components =
      status.GetMakefile().GetGlobalGenerator()->GetInstallComponents();
    output = cmJoin(*components, ";");
  } else {
    cmValue prop = nullptr;
    if (!args[1].empty()) {
      prop = status.GetMakefile().GetState()->GetGlobalProperty(args[1]);
    }
    if (prop) {
      output = *prop;
    }
  }

  status.GetMakefile().AddDefinition(variable, output);

  return true;
}